

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void Assimp::Write(JSONWriter *out,aiMatrix4x4 *ai,bool is_elem)

{
  float *pfVar1;
  long lVar2;
  uint x;
  uint p_iIndex;
  
  JSONWriter::StartArray(out,is_elem);
  for (p_iIndex = 0; p_iIndex != 4; p_iIndex = p_iIndex + 1) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      pfVar1 = aiMatrix4x4t<float>::operator[](ai,p_iIndex);
      JSONWriter::Element<float>(out,(float *)((long)pfVar1 + lVar2));
    }
  }
  JSONWriter::EndArray(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiMatrix4x4& ai, bool is_elem = true) {
    out.StartArray(is_elem);
    for (unsigned int x = 0; x < 4; ++x) {
        for (unsigned int y = 0; y < 4; ++y) {
            out.Element(ai[x][y]);
        }
    }
    out.EndArray();
}